

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O2

void xreq0_putq_cb(void *arg)

{
  nni_aio *aio;
  nng_err nVar1;
  nni_msg *m;
  
  aio = (nni_aio *)((long)arg + 0x568);
  nVar1 = nni_aio_result(aio);
  if (nVar1 != NNG_OK) {
    m = nni_aio_get_msg(aio);
    nni_msg_free(m);
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_pipe_close(*arg);
    return;
  }
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x3a0));
  return;
}

Assistant:

static void
xreq0_putq_cb(void *arg)
{
	xreq0_pipe *p = arg;

	if (nni_aio_result(&p->aio_putq) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_putq));
		nni_aio_set_msg(&p->aio_putq, NULL);
		nni_pipe_close(p->pipe);
		return;
	}
	nni_aio_set_msg(&p->aio_putq, NULL);

	nni_pipe_recv(p->pipe, &p->aio_recv);
}